

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::
Span<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_>::erase
          (Span<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_>
           *this,size_t bucket)

{
  byte bVar1;
  void *pvVar2;
  void *pvVar3;
  
  bVar1 = this->offsets[bucket];
  this->offsets[bucket] = 0xff;
  pvVar3 = *(void **)(this->entries[bVar1].storage.data + 8);
  while (pvVar3 != (void *)0x0) {
    pvVar2 = *(void **)((long)pvVar3 + 0x10);
    operator_delete(pvVar3,0x18);
    pvVar3 = pvVar2;
  }
  this->entries[bVar1].storage.data[0] = this->nextFree;
  this->nextFree = bVar1;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }